

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayerThreadPool.cpp
# Opt level: O2

void __thiscall PyreNet::LayerThreadPool::addJob(LayerThreadPool *this,LayerQueueJob *job)

{
  undefined1 local_28 [8];
  unique_lock<std::mutex> lg;
  
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_28,&this->queueMutex);
  std::
  deque<PyreNet::LayerThreadPool::LayerQueueJob,_std::allocator<PyreNet::LayerThreadPool::LayerQueueJob>_>
  ::push_back(&(this->layerQueue).c,job);
  std::condition_variable::notify_one();
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_28);
  return;
}

Assistant:

void LayerThreadPool::addJob(const LayerThreadPool::LayerQueueJob &job) {
        std::unique_lock<std::mutex> lg(queueMutex);
        layerQueue.push(job);
        newJobCv.notify_one();
    }